

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

void pgraph_dump_celsius_pipe(int cnum,pgraph_state *state)

{
  uint32_t local_94;
  uint local_90;
  uint32_t word;
  uint i_9;
  int i_8;
  uint32_t vtx [20];
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  pgraph_state *state_local;
  int cnum_local;
  
  nva_wr32(cnum,0x40014c,0x56);
  if ((state->celsius_pipe_broke_ovtx & 1U) != 0) {
    pgraph_dump_pipe(cnum,0x4470,state->celsius_pipe_junk,4);
  }
  for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
    pgraph_dump_pipe(cnum,i_2 * 0x40 + 0x800,state->celsius_pipe_ovtx[i_2],0x10);
  }
  pgraph_dump_pipe(cnum,0x4400,state->celsius_pipe_vtx,0x1c);
  if ((state->celsius_pipe_broke_ovtx & 1U) == 0) {
    pgraph_dump_pipe(cnum,0x4470,state->celsius_pipe_junk,4);
  }
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    pgraph_dump_pipe(cnum,i_3 * 0x40 + 0x200,state->celsius_pipe_xvtx[i_3],0x10);
  }
  for (i_4 = 0; i_4 < 0x3c; i_4 = i_4 + 1) {
    pgraph_dump_pipe(cnum,i_4 * 0x10 + 0x6400,state->celsius_pipe_xfrm[i_4],4);
  }
  for (i_5 = 0; i_5 < 0x30; i_5 = i_5 + 1) {
    pgraph_dump_pipe(cnum,i_5 * 0x10 + 0x6800,state->celsius_pipe_light_v[i_5],3);
  }
  for (i_6 = 0; i_6 < 3; i_6 = i_6 + 1) {
    pgraph_dump_pipe(cnum,i_6 * 0x10 + 0x6c00,state->celsius_pipe_light_sa + i_6,1);
  }
  for (i_7 = 0; i_7 < 0x13; i_7 = i_7 + 1) {
    pgraph_dump_pipe(cnum,i_7 * 0x10 + 0x7000,state->celsius_pipe_light_sb + i_7,1);
  }
  for (vtx[0x13] = 0; (int)vtx[0x13] < 0xc; vtx[0x13] = vtx[0x13] + 1) {
    pgraph_dump_pipe(cnum,vtx[0x13] * 0x10 + 0x7400,state->celsius_pipe_light_sc + (int)vtx[0x13],1)
    ;
  }
  for (vtx[0x12] = 0; (int)vtx[0x12] < 0xc; vtx[0x12] = vtx[0x12] + 1) {
    pgraph_dump_pipe(cnum,vtx[0x12] * 0x10 + 0x7800,state->celsius_pipe_light_sd + (int)vtx[0x12],1)
    ;
  }
  pgraph_dump_pipe(cnum,0,&i_9,0x14);
  for (word = 0; (int)word < 8; word = word + 1) {
    state->celsius_pipe_vtxbuf_offset[(int)word] = (&i_9)[(int)(word << 1)];
    state->celsius_pipe_vtxbuf_format[(int)word] = (&i_9)[(int)(word * 2 + 1)];
  }
  state->celsius_pipe_begin_end = vtx[0xe];
  state->celsius_pipe_edge_flag = vtx[0xf];
  state->celsius_pipe_unk48 = vtx[0x10];
  state->celsius_pipe_vtx_state = vtx[0x11];
  if ((state->chipset).chipset == 0x10) {
    for (local_90 = 7; local_90 != 0; local_90 = local_90 - 1) {
      local_94 = 0;
      pgraph_load_pipe(cnum,4,&local_94,1);
      pgraph_dump_pipe(cnum,0x4c,&local_94,1);
      if ((local_94 & 0x1f) != local_90) {
        state->celsius_pipe_vtxbuf_format[local_90] =
             state->celsius_pipe_vtxbuf_format[local_90] & 0xffffff8f;
      }
      local_94 = 0;
      pgraph_load_pipe(cnum,local_90 * 8 + 4,&local_94,1);
    }
  }
  return;
}

Assistant:

void pgraph_dump_celsius_pipe(int cnum, struct pgraph_state *state) {
	nva_wr32(cnum, 0x40014c, 0x00000056);
	if (state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 0x10; i++)
		pgraph_dump_pipe(cnum, 0x0800 + i * 0x40, state->celsius_pipe_ovtx[i], 0x10);
	pgraph_dump_pipe(cnum, 0x4400, state->celsius_pipe_vtx, 0x1c);
	if (!state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 3; i++)
		pgraph_dump_pipe(cnum, 0x0200 + i * 0x40, state->celsius_pipe_xvtx[i], 0x10);
	for (int i = 0; i < 0x3c; i++) {
		pgraph_dump_pipe(cnum, 0x6400 + i * 0x10, state->celsius_pipe_xfrm[i], 4);
	}
	for (int i = 0; i < 0x30; i++) {
		pgraph_dump_pipe(cnum, 0x6800 + i * 0x10, state->celsius_pipe_light_v[i], 3);
	}
	for (int i = 0; i < 3; i++) {
		pgraph_dump_pipe(cnum, 0x6c00 + i * 0x10, state->celsius_pipe_light_sa + i, 1);
	}
	for (int i = 0; i < 19; i++) {
		pgraph_dump_pipe(cnum, 0x7000 + i * 0x10, state->celsius_pipe_light_sb + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7400 + i * 0x10, state->celsius_pipe_light_sc + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7800 + i * 0x10, state->celsius_pipe_light_sd + i, 1);
	}
	uint32_t vtx[20];
	pgraph_dump_pipe(cnum, 0x0000, vtx, 20);
	for (int i = 0; i < 8; i++) {
		state->celsius_pipe_vtxbuf_offset[i] = vtx[2*i];
		state->celsius_pipe_vtxbuf_format[i] = vtx[2*i+1];
	}
	state->celsius_pipe_begin_end = vtx[16];
	state->celsius_pipe_edge_flag = vtx[17];
	state->celsius_pipe_unk48 = vtx[18];
	state->celsius_pipe_vtx_state = vtx[19];
	if (state->chipset.chipset == 0x10) {
		// Fuck me with a chainsaw.  On NV10, vtxbuf_format readout is broken in
		// two ways:
		//
		// 1. If component count is 0 (ie. a vtxbuf is disabled), it reads as some
		//    non-zero value depending on the attribute instead.
		// 2. Bit 2 of format of attribute 2 (ie. secondary color) comes from
		//    attribute 1 (primary color) instead.
		//
		// Work around #1 by observing the last active attribute in vtx_state.
		for (unsigned i = 7; i > 0; i--) {
			uint32_t word = 0;
			pgraph_load_pipe(cnum, 4, &word, 1);
			pgraph_dump_pipe(cnum, 0x4c, &word, 1);
			if (extr(word, 0, 5) != i)
				insrt(state->celsius_pipe_vtxbuf_format[i], 4, 3, 0);
			word = 0;
			pgraph_load_pipe(cnum, i*8+4, &word, 1);
		}
	}
}